

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O2

string_view __thiscall slang::ast::DefinitionSymbol::getArticleKindString(DefinitionSymbol *this)

{
  char *pcVar1;
  string_view sVar2;
  size_t sStack_8;
  
  if (this->definitionKind == Module) {
    pcVar1 = "a module";
    sStack_8 = 8;
  }
  else if (this->definitionKind == Program) {
    pcVar1 = "a program";
    sStack_8 = 9;
  }
  else {
    pcVar1 = "an interface";
    sStack_8 = 0xc;
  }
  sVar2._M_str = pcVar1;
  sVar2._M_len = sStack_8;
  return sVar2;
}

Assistant:

std::string_view DefinitionSymbol::getArticleKindString() const {
    switch (definitionKind) {
        case DefinitionKind::Module:
            return "a module"sv;
        case DefinitionKind::Interface:
            return "an interface"sv;
        case DefinitionKind::Program:
            return "a program"sv;
    }
    SLANG_UNREACHABLE;
}